

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_ObjPrintNeighborhood(Abc_Obj_t *pObj,int depth)

{
  Vec_Ptr_t *vNodes;
  void *pvVar1;
  
  vNodes = Vec_PtrAlloc(100);
  Abc_ObjPrintNeighborhood_rec(pObj,vNodes,depth);
  while (vNodes->nSize != 0) {
    pvVar1 = Vec_PtrPop(vNodes);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xbf;
  }
  Vec_PtrFree(vNodes);
  return;
}

Assistant:

void Abc_ObjPrintNeighborhood( Abc_Obj_t *pObj, int depth ) {
  Vec_Ptr_t *vNodes = Vec_PtrAlloc(100); 
  Abc_Obj_t *pObj2;

  Abc_ObjPrintNeighborhood_rec( pObj, vNodes, depth );

  while(Vec_PtrSize(vNodes)) {
    pObj2 = (Abc_Obj_t*)Vec_PtrPop(vNodes);
    pObj2->fMarkC = 0;
  }

  Vec_PtrFree(vNodes);
}